

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O3

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyAllElementsAndMatchersAreMatched
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  long *plVar2;
  pointer pbVar3;
  ulong uVar4;
  MatchResultListener *pMVar5;
  pointer pcVar6;
  ulong uVar7;
  pointer pcVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  char *sep;
  vector<char,_std::allocator<char>_> matcher_matched;
  vector<char,_std::allocator<char>_> element_matched;
  char *local_78;
  char *local_70;
  vector<char,_std::allocator<char>_> local_68;
  vector<char,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 0;
  local_38 = element_printouts;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_50,*(size_type *)matrix,(value_type *)&local_68,(allocator_type *)&local_78);
  local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68,*(size_type *)(matrix + 8),(value_type *)&local_78,
             (allocator_type *)&local_70);
  uVar9 = *(ulong *)matrix;
  if (uVar9 != 0) {
    uVar7 = *(ulong *)(matrix + 8);
    uVar4 = 0;
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar9 = 0;
        do {
          bVar11 = *(char *)(uVar9 + uVar7 * uVar4 + *(long *)(matrix + 0x10)) == '\x01';
          local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar4] =
               local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4] | bVar11;
          pbVar1 = (byte *)(CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar9);
          *pbVar1 = *pbVar1 | bVar11;
          uVar9 = uVar9 + 1;
          uVar7 = *(ulong *)(matrix + 8);
        } while (uVar9 < uVar7);
        uVar9 = *(ulong *)matrix;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar9);
  }
  local_78 = "where the following matchers don\'t match any elements:\n";
  pcVar8 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,
                             local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start._0_1_);
  bVar11 = true;
  if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar8) {
    uVar9 = 0;
    pcVar6 = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if (pcVar8[uVar9] == '\0') {
        if (*(long *)(listener + 8) != 0) {
          pMVar5 = MatchResultListener::operator<<(listener,&local_78);
          pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x17d5dc);
          if (*(ulong *)(pMVar5 + 8) != 0) {
            std::ostream::_M_insert<unsigned_long>(*(ulong *)(pMVar5 + 8));
          }
          MatchResultListener::operator<<(pMVar5,(char (*) [3])0x17c3e1);
          plVar2 = *(long **)(*(long *)this + uVar9 * 8);
          (**(code **)(*plVar2 + 0x10))(plVar2,*(undefined8 *)(listener + 8));
          local_78 = ",\n";
          pcVar8 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_);
          pcVar6 = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        bVar11 = false;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)pcVar6 - (long)pcVar8));
  }
  local_78 = "where the following elements don\'t match any matchers:\n";
  local_70 = "\nand ";
  if (bVar11) {
    local_70 = "";
  }
  pcVar6 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar10 = 8;
    uVar9 = 0;
    pcVar8 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if (pcVar6[uVar9] == '\0') {
        if (*(long *)(listener + 8) != 0) {
          pMVar5 = MatchResultListener::operator<<(listener,&local_70);
          pMVar5 = MatchResultListener::operator<<(pMVar5,&local_78);
          pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x17d5c3);
          if (*(ulong *)(pMVar5 + 8) != 0) {
            std::ostream::_M_insert<unsigned_long>(*(ulong *)(pMVar5 + 8));
          }
          pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [3])0x17c3e1);
          if (*(ostream **)(pMVar5 + 8) != (ostream *)0x0) {
            pbVar3 = (local_38->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      (*(ostream **)(pMVar5 + 8),*(char **)((long)pbVar3 + lVar10 + -8),
                       *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10));
          }
          local_78 = ",\n";
          local_70 = "";
          pcVar6 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar8 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        bVar11 = false;
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x20;
    } while (uVar9 < (ulong)((long)pcVar8 - (long)pcVar6));
    pcVar8 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,
                               local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._0_1_);
  }
  if (pcVar8 != (pointer)0x0) {
    operator_delete(pcVar8);
    pcVar6 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (pcVar6 != (pointer)0x0) {
    operator_delete(pcVar6);
  }
  return bVar11;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::
VerifyAllElementsAndMatchersAreMatched(
    const ::std::vector<string>& element_printouts,
    const MatchMatrix& matrix,
    MatchResultListener* listener) const {
  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi])
        continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei])
        continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}